

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

ParseStatus CreateRawImageDemuxer(MemBuffer *mem,WebPDemuxer **demuxer)

{
  uint uVar1;
  VP8StatusCode VVar2;
  int iVar3;
  WebPDemuxer *dmux_00;
  Frame *frame_00;
  undefined8 *in_RSI;
  long in_RDI;
  Frame *frame;
  WebPDemuxer *dmux;
  VP8StatusCode status;
  WebPBitstreamFeatures features;
  size_t in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  WebPBitstreamFeatures local_40;
  undefined8 *local_18;
  long local_10;
  ParseStatus local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  VVar2 = WebPGetFeatures(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                          (WebPBitstreamFeatures *)0x108b6a);
  *local_18 = 0;
  if (VVar2 == VP8_STATUS_OK) {
    dmux_00 = (WebPDemuxer *)
              WebPSafeCalloc((ulong)in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
    frame_00 = (Frame *)WebPSafeCalloc(CONCAT44(VVar2,in_stack_ffffffffffffffb8),(size_t)dmux_00);
    if ((dmux_00 != (WebPDemuxer *)0x0) && (frame_00 != (Frame *)0x0)) {
      InitDemux(dmux_00,(MemBuffer *)frame_00);
      SetFrameInfo(0,*(size_t *)(local_10 + 0x18),1,1,&local_40,frame_00);
      iVar3 = AddFrame(dmux_00,frame_00);
      if (iVar3 != 0) {
        dmux_00->state = WEBP_DEMUX_DONE;
        dmux_00->canvas_width = frame_00->width;
        dmux_00->canvas_height = frame_00->height;
        uVar1 = 0;
        if (frame_00->has_alpha != 0) {
          uVar1 = 0x10;
        }
        dmux_00->feature_flags = uVar1 | dmux_00->feature_flags;
        dmux_00->num_frames = 1;
        *local_18 = dmux_00;
        return PARSE_OK;
      }
    }
    WebPSafeFree((void *)0x108c95);
    WebPSafeFree((void *)0x108c9e);
    local_4 = PARSE_ERROR;
  }
  else {
    local_4 = PARSE_ERROR;
    if (VVar2 == VP8_STATUS_NOT_ENOUGH_DATA) {
      local_4 = PARSE_NEED_MORE_DATA;
    }
  }
  return local_4;
}

Assistant:

static ParseStatus CreateRawImageDemuxer(MemBuffer* const mem,
                                         WebPDemuxer** demuxer) {
  WebPBitstreamFeatures features;
  const VP8StatusCode status =
      WebPGetFeatures(mem->buf, mem->buf_size, &features);
  *demuxer = NULL;
  if (status != VP8_STATUS_OK) {
    return (status == VP8_STATUS_NOT_ENOUGH_DATA) ? PARSE_NEED_MORE_DATA
                                                  : PARSE_ERROR;
  }

  {
    WebPDemuxer* const dmux = (WebPDemuxer*)WebPSafeCalloc(1ULL, sizeof(*dmux));
    Frame* const frame = (Frame*)WebPSafeCalloc(1ULL, sizeof(*frame));
    if (dmux == NULL || frame == NULL) goto Error;
    InitDemux(dmux, mem);
    SetFrameInfo(0, mem->buf_size, 1 /*frame_num*/, 1 /*complete*/, &features,
                 frame);
    if (!AddFrame(dmux, frame)) goto Error;
    dmux->state = WEBP_DEMUX_DONE;
    dmux->canvas_width = frame->width;
    dmux->canvas_height = frame->height;
    dmux->feature_flags |= frame->has_alpha ? ALPHA_FLAG : 0;
    dmux->num_frames = 1;
    assert(IsValidSimpleFormat(dmux));
    *demuxer = dmux;
    return PARSE_OK;

 Error:
    WebPSafeFree(dmux);
    WebPSafeFree(frame);
    return PARSE_ERROR;
  }
}